

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O3

DbConnection * __thiscall
Config::GetDbConnection(DbConnection *__return_storage_ptr__,Config *this,char *connection)

{
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *pGVar1;
  Type pGVar2;
  Ch *pCVar3;
  Number NVar4;
  allocator<char> local_41;
  Data local_40;
  long local_30 [2];
  
  pGVar1 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            *)rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>
                        ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          *)this,"DbConnections");
  pGVar1 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            *)rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>(pGVar1,connection);
  if (*(short *)(pGVar1 + 0xe) != 3) {
    __assert_fail("IsObject()",
                  "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/rapidjson/document.h"
                  ,0x62c,
                  "Object rapidjson::GenericValue<rapidjson::UTF8<>>::GetObject() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  (__return_storage_ptr__->Host)._M_dataplus._M_p = (pointer)0x0;
  (__return_storage_ptr__->Host)._M_string_length = 0;
  (__return_storage_ptr__->Host).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->Host).field_2 + 8) = 0;
  (__return_storage_ptr__->User)._M_dataplus._M_p = (pointer)0x0;
  (__return_storage_ptr__->User)._M_string_length = 0;
  (__return_storage_ptr__->User).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->User).field_2 + 8) = 0;
  (__return_storage_ptr__->Pwd)._M_dataplus._M_p = (pointer)0x0;
  (__return_storage_ptr__->Pwd)._M_string_length = 0;
  (__return_storage_ptr__->Pwd).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->Pwd).field_2 + 8) = 0;
  (__return_storage_ptr__->Db).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->Db).field_2 + 8) = 0;
  *(undefined8 *)&__return_storage_ptr__->Port = 0;
  (__return_storage_ptr__->Db)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->Db).field_2;
  (__return_storage_ptr__->Db)._M_string_length = 0;
  (__return_storage_ptr__->Host)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->Host).field_2
  ;
  (__return_storage_ptr__->Host).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->User)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->User).field_2
  ;
  (__return_storage_ptr__->User).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->Pwd)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->Pwd).field_2;
  (__return_storage_ptr__->Pwd).field_2._M_local_buf[0] = '\0';
  pGVar2 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(pGVar1,"Db");
  pCVar3 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(pGVar2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40.s,pCVar3,&local_41);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40.s);
  if (local_40.n.i64 != (Number)local_30) {
    operator_delete((void *)local_40.n,local_30[0] + 1);
  }
  pGVar2 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(pGVar1,"Host");
  pCVar3 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(pGVar2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40.s,pCVar3,&local_41);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->Host,(string *)&local_40.s);
  if (local_40.n.i64 != (Number)local_30) {
    operator_delete((void *)local_40.n,local_30[0] + 1);
  }
  pGVar2 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(pGVar1,"Pwd");
  pCVar3 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(pGVar2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40.s,pCVar3,&local_41);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->Pwd,(string *)&local_40.s);
  if (local_40.n.i64 != (Number)local_30) {
    operator_delete((void *)local_40.n,local_30[0] + 1);
  }
  pGVar2 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(pGVar1,"User");
  pCVar3 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(pGVar2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40.s,pCVar3,&local_41);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->User,(string *)&local_40.s);
  if (local_40.n.i64 != (Number)local_30) {
    operator_delete((void *)local_40.n,local_30[0] + 1);
  }
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_40.s,(Ch *)pGVar1);
  NVar4.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            *)pGVar1);
  if (local_40.n.i64 != (Number)NVar4.i64) {
    pGVar2 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(pGVar1,"Port");
    if ((undefined1  [16])((undefined1  [16])pGVar2->data_ & (undefined1  [16])0x40000000000000) ==
        (undefined1  [16])0x0) {
      __assert_fail("data_.f.flags & kUintFlag",
                    "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/rapidjson/document.h"
                    ,0x6e8,
                    "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                   );
    }
    __return_storage_ptr__->Port = (pGVar2->data_).s.length;
  }
  return __return_storage_ptr__;
}

Assistant:

DbConnection Config::GetDbConnection(const char* connection)
{
    auto conn = Settings["DbConnections"][connection].GetObject();
    DbConnection result = DbConnection();
    result.Db = std::string(conn["Db"].GetString());
    result.Host = std::string(conn["Host"].GetString());
    result.Pwd = std::string(conn["Pwd"].GetString());
    result.User = std::string(conn["User"].GetString());
    if(conn.HasMember("Port"))
    {
        result.Port = conn["Port"].GetUint();
    }
    return result;   
}